

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginPopupContextVoid(char *str_id,int mouse_button)

{
  bool bVar1;
  char *str_id_00;
  
  str_id_00 = "void_context_menu";
  if (str_id != (char *)0x0) {
    str_id_00 = str_id;
  }
  if (GImGui->HoveredWindow == (ImGuiWindow *)0x0) {
    bVar1 = IsMouseClicked(mouse_button,false);
    if (bVar1) {
      OpenPopupEx(str_id_00,true);
    }
  }
  bVar1 = BeginPopup(str_id_00);
  return bVar1;
}

Assistant:

bool ImGui::BeginPopupContextVoid(const char* str_id, int mouse_button)
{
    if (!str_id) str_id = "void_context_menu";
    if (!IsMouseHoveringAnyWindow() && IsMouseClicked(mouse_button))
        OpenPopupEx(str_id, true);
    return BeginPopup(str_id);
}